

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_test.cpp
# Opt level: O0

void __thiscall
TimedMutexTest_TryLockUntil_Test<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::PhaseFairness>_>
::TestBody(TimedMutexTest_TryLockUntil_Test<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::PhaseFairness>_>
           *this)

{
  bool bVar1;
  char *message;
  size_t *in_RCX;
  anon_class_16_2_e823ffd4_for_f f;
  AssertHelper local_e8;
  Message local_e0;
  uint local_d4;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar;
  undefined1 local_a0 [8];
  size_t counter;
  TypeParam mtx;
  TimedMutexTest_TryLockUntil_Test<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::PhaseFairness>_>
  *this_local;
  
  yamc::fair::basic_shared_timed_mutex<yamc::rwlock::PhaseFairness>::basic_shared_timed_mutex
            ((basic_shared_timed_mutex<yamc::rwlock::PhaseFairness> *)&counter);
  local_a0 = (undefined1  [8])0x0;
  f.counter = in_RCX;
  f.mtx = (TypeParam *)local_a0;
  yamc::test::
  task_runner<TimedMutexTest_TryLockUntil_Test<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::PhaseFairness>>::TestBody()::_lambda(unsigned_long)_1_>
            ((test *)0x8,(size_t)&counter,f);
  local_d4 = 80000;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_d0,"10000u * 8","counter",&local_d4,(unsigned_long *)local_a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/basic_test.cpp"
               ,0x124,message);
    testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  yamc::fair::basic_shared_timed_mutex<yamc::rwlock::PhaseFairness>::~basic_shared_timed_mutex
            ((basic_shared_timed_mutex<yamc::rwlock::PhaseFairness> *)&counter);
  return;
}

Assistant:

TYPED_TEST(TimedMutexTest, TryLockUntil)
{
  TypeParam mtx;
  std::size_t counter = 0;
  yamc::test::task_runner(
    TEST_THREADS,
    [&](std::size_t /*id*/) {
      for (std::size_t n = 0; n < TEST_ITERATION; ++n) {
        while (!mtx.try_lock_until(std::chrono::system_clock::now() + TEST_NOT_TIMEOUT)) {
          std::this_thread::yield();
        }
        std::lock_guard<TypeParam> lk(mtx, std::adopt_lock);
        counter = counter + 1;
      }
    });
  EXPECT_EQ(TEST_ITERATION * TEST_THREADS, counter);
}